

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall wabt::Stream::Truncate(Stream *this,size_t size)

{
  bool bVar1;
  Enum EVar2;
  size_t size_local;
  Stream *this_local;
  
  bVar1 = Failed((Result)(this->result_).enum_);
  if (!bVar1) {
    if (this->log_stream_ != (Stream *)0x0) {
      Writef(this->log_stream_,"; truncate to %zd (0x%zx)\n",size,size);
    }
    EVar2 = (*this->_vptr_Stream[5])(this,size);
    (this->result_).enum_ = EVar2;
    bVar1 = Succeeded((Result)(this->result_).enum_);
    if ((bVar1) && (size < this->offset_)) {
      this->offset_ = size;
    }
  }
  return;
}

Assistant:

void Stream::Truncate(size_t size) {
  if (Failed(result_)) {
    return;
  }
  if (log_stream_) {
    log_stream_->Writef("; truncate to %" PRIzd " (0x%" PRIzx ")\n", size,
                        size);
  }
  result_ = TruncateImpl(size);
  if (Succeeded(result_) && offset_ > size) {
    offset_ = size;
  }
}